

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O2

void __thiscall
rsg::ProgramExecutor::execute
          (ProgramExecutor *this,Shader *vertexShader,Shader *fragmentShader,
          vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_> *uniformValues)

{
  int gridVtxHeight;
  int iVar1;
  ShaderInput *pSVar2;
  Variable *pVVar3;
  Variable *type;
  ConstValueRangeAccess valueRange;
  undefined8 uVar4;
  undefined8 uVar5;
  int gridVtxWidth;
  int iVar6;
  deBool dVar7;
  int iVar8;
  pointer ppVVar9;
  VaryingStorage *pVVar10;
  TestError *this_00;
  uint uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  pointer pVVar16;
  pointer ppSVar17;
  int iVar18;
  int iVar19;
  float fVar20;
  float fVar21;
  float cellHeight;
  float fVar22;
  float cellWidth;
  float __x;
  ExecValueAccess EVar23;
  ConstStridedValueAccess<64> CVar24;
  ValueAccess dst;
  ConstValueAccess vtx0;
  ConstValueAccess vtx1;
  ConstValueAccess vtx2;
  ConstValueAccess vtx3;
  IVec4 vtxIndices;
  vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> outputs;
  Vec4 c;
  ExecutionContext execCtx;
  VaryingStore varyingStore;
  
  iVar1 = this->m_gridWidth;
  iVar8 = this->m_gridHeight;
  gridVtxWidth = iVar1 + 1;
  gridVtxHeight = iVar8 + 1;
  uVar13 = gridVtxHeight * gridVtxWidth;
  varyingStore.m_values._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &varyingStore.m_values._M_t._M_impl.super__Rb_tree_header._M_header;
  varyingStore.m_values._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  varyingStore.m_values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  varyingStore.m_values._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  varyingStore.m_numVertices = uVar13;
  varyingStore.m_values._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       varyingStore.m_values._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ExecutionContext::ExecutionContext(&execCtx,&this->m_samplers2D,&this->m_samplersCube);
  iVar14 = (uVar13 + 1) - (uint)((uVar13 & 0x3f) == 0);
  outputs.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Shader::getOutputs(vertexShader,&outputs);
  for (pVVar16 = (uniformValues->
                 super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      pVVar16 !=
      (uniformValues->super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>).
      _M_impl.super__Vector_impl_data._M_finish; pVVar16 = pVVar16 + 1) {
    vtxIndices.m_data = *(int (*) [4])pVVar16;
    c.m_data = (float  [4])ExecutionContext::getValue(&execCtx,pVVar16->m_variable);
    StridedValueAccess<64>::operator=
              ((StridedValueAccess<64> *)&c,(StridedValueRead<1> *)&vtxIndices);
  }
  iVar18 = 0;
  if (iVar14 < 1) {
    iVar14 = iVar18;
  }
  iVar19 = 0;
  while (iVar19 != iVar14) {
    iVar19 = iVar19 + 1;
    uVar11 = iVar19 * 0x40;
    if ((int)uVar13 <= iVar19 * 0x40) {
      uVar11 = uVar13;
    }
    for (ppSVar17 = (vertexShader->m_inputs).
                    super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        ppSVar17 !=
        (vertexShader->m_inputs).
        super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppSVar17 = ppSVar17 + 1) {
      pSVar2 = *ppSVar17;
      EVar23 = ExecutionContext::getValue(&execCtx,pSVar2->m_variable);
      for (iVar15 = 0; iVar6 = iVar18 + iVar15, iVar6 < (int)uVar11; iVar15 = iVar15 + 1) {
        uVar4 = pSVar2->m_variable;
        uVar5 = (pSVar2->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_start;
        valueRange.m_min = (Scalar *)uVar5;
        valueRange.m_type = (VariableType *)uVar4;
        valueRange.m_max =
             (pSVar2->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
        interpolateVertexInput<64>
                  ((StridedValueAccess<64>)EVar23.super_ConstStridedValueAccess<64>,iVar15,
                   valueRange,(float)(iVar6 % gridVtxWidth) / (float)iVar1,
                   (float)(iVar6 / gridVtxWidth) / (float)iVar8);
      }
    }
    Shader::execute(vertexShader,&execCtx);
    for (ppVVar9 = outputs.
                   super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppVVar9 !=
        outputs.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppVVar9 = ppVVar9 + 1) {
      pVVar3 = *ppVVar9;
      dVar7 = deStringEqual((pVVar3->m_name)._M_dataplus._M_p,"gl_Position");
      if (dVar7 == 0) {
        CVar24 = (ConstStridedValueAccess<64>)ExecutionContext::getValue(&execCtx,pVVar3);
        pVVar10 = VaryingStore::getStorage
                            (&varyingStore,&pVVar3->m_type,(pVVar3->m_name)._M_dataplus._M_p);
        for (iVar15 = 0; iVar15 + iVar18 < (int)uVar11; iVar15 = iVar15 + 1) {
          dst = VaryingStorage::getValue(pVVar10,&pVVar3->m_type,iVar15 + iVar18);
          copyVarying<64>(dst,CVar24,iVar15);
        }
      }
    }
    iVar18 = iVar18 + 0x40;
  }
  std::_Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::~_Vector_base
            (&outputs.
              super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>);
  ExecutionContext::~ExecutionContext(&execCtx);
  ExecutionContext::ExecutionContext(&execCtx,&this->m_samplers2D,&this->m_samplersCube);
  for (pVVar16 = (uniformValues->
                 super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      pVVar16 !=
      (uniformValues->super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>).
      _M_impl.super__Vector_impl_data._M_finish; pVVar16 = pVVar16 + 1) {
    outputs.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)pVVar16->m_variable;
    outputs.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)(pVVar16->m_storage).m_value.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_start;
    vtxIndices.m_data = (int  [4])ExecutionContext::getValue(&execCtx,pVVar16->m_variable);
    StridedValueAccess<64>::operator=
              ((StridedValueAccess<64> *)&vtxIndices,(StridedValueRead<1> *)&outputs);
  }
  outputs.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Shader::getOutputs(fragmentShader,&outputs);
  ppVVar9 = outputs.
            super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppVVar9 ==
        outputs.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"fragColorVar",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgProgramExecutor.cpp"
                 ,299);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pVVar3 = *ppVVar9;
    ppVVar9 = ppVVar9 + 1;
  } while (pVVar3->m_layoutLocation != 0);
  iVar1 = (this->m_dst).super_ConstPixelBufferAccess.m_size.m_data[0];
  iVar8 = (this->m_dst).super_ConstPixelBufferAccess.m_size.m_data[1];
  uVar13 = iVar8 * iVar1;
  cellWidth = (float)iVar1 / (float)this->m_gridWidth;
  iVar14 = ((int)uVar13 / 0x40 + 1) - (uint)((uVar13 & 0x3f) == 0);
  cellHeight = (float)iVar8 / (float)this->m_gridHeight;
  iVar8 = 0;
  if (iVar14 < 1) {
    iVar14 = 0;
  }
  iVar18 = 0;
  while (iVar18 != iVar14) {
    lVar12 = (long)iVar8;
    iVar18 = iVar18 + 1;
    uVar11 = iVar18 * 0x40;
    if ((int)uVar13 <= iVar18 * 0x40) {
      uVar11 = uVar13;
    }
    for (ppSVar17 = (fragmentShader->m_inputs).
                    super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        ppSVar17 !=
        (fragmentShader->m_inputs).
        super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppSVar17 = ppSVar17 + 1) {
      pSVar2 = *ppSVar17;
      EVar23 = ExecutionContext::getValue(&execCtx,pSVar2->m_variable);
      type = pSVar2->m_variable;
      pVVar10 = VaryingStore::getStorage
                          (&varyingStore,&type->m_type,(type->m_name)._M_dataplus._M_p);
      iVar19 = 0;
      while( true ) {
        iVar15 = iVar8 + iVar19;
        if ((int)uVar11 <= iVar15) break;
        computeVertexIndices
                  ((rsg *)&vtxIndices,cellWidth,cellHeight,gridVtxWidth,gridVtxHeight,iVar15 % iVar1
                   ,iVar15 / iVar1);
        fVar22 = ((float)(iVar15 % iVar1) + 0.5) / cellWidth;
        __x = ((float)(iVar15 / iVar1) + 0.5) / cellHeight;
        fVar20 = floorf(fVar22);
        fVar21 = floorf(__x);
        vtx0 = VaryingStorage::getValue(pVVar10,&type->m_type,vtxIndices.m_data[0]);
        vtx1 = VaryingStorage::getValue(pVVar10,&type->m_type,vtxIndices.m_data[1]);
        vtx2 = VaryingStorage::getValue(pVVar10,&type->m_type,vtxIndices.m_data[2]);
        vtx3 = VaryingStorage::getValue(pVVar10,&type->m_type,vtxIndices.m_data[3]);
        interpolateFragmentInput<64>
                  ((StridedValueAccess<64>)EVar23.super_ConstStridedValueAccess<64>,iVar19,vtx0,vtx1
                   ,vtx2,vtx3,fVar22 - fVar20,__x - fVar21);
        iVar19 = iVar19 + 1;
      }
    }
    Shader::execute(fragmentShader,&execCtx);
    vtxIndices.m_data = (int  [4])ExecutionContext::getValue(&execCtx,pVVar3);
    iVar19 = 0;
    for (; lVar12 < (int)uVar11; lVar12 = lVar12 + 1) {
      CVar24 = ConstStridedValueAccess<64>::component((ConstStridedValueAccess<64> *)&vtxIndices,0);
      fVar20 = (float)CVar24.m_value[iVar19].intVal;
      CVar24 = ConstStridedValueAccess<64>::component((ConstStridedValueAccess<64> *)&vtxIndices,1);
      fVar21 = (float)CVar24.m_value[iVar19].intVal;
      CVar24 = ConstStridedValueAccess<64>::component((ConstStridedValueAccess<64> *)&vtxIndices,2);
      fVar22 = (float)CVar24.m_value[iVar19].intVal;
      CVar24 = ConstStridedValueAccess<64>::component((ConstStridedValueAccess<64> *)&vtxIndices,3);
      c.m_data[1] = fVar21;
      c.m_data[0] = fVar20;
      c.m_data[2] = fVar22;
      c.m_data[3] = (float)CVar24.m_value[iVar19].intVal;
      tcu::PixelBufferAccess::setPixel
                (&this->m_dst,&c,(iVar8 + iVar19) % iVar1,
                 ~((iVar8 + iVar19) / iVar1) +
                 (this->m_dst).super_ConstPixelBufferAccess.m_size.m_data[1],0);
      iVar19 = iVar19 + 1;
    }
    iVar8 = iVar8 + 0x40;
  }
  std::_Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::~_Vector_base
            (&outputs.
              super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>);
  ExecutionContext::~ExecutionContext(&execCtx);
  VaryingStore::~VaryingStore(&varyingStore);
  return;
}

Assistant:

void ProgramExecutor::execute (const Shader& vertexShader, const Shader& fragmentShader, const vector<VariableValue>& uniformValues)
{
	int	gridVtxWidth	= m_gridWidth+1;
	int gridVtxHeight	= m_gridHeight+1;
	int numVertices		= gridVtxWidth*gridVtxHeight;

	VaryingStore varyingStore(numVertices);

	// Execute vertex shader
	{
		ExecutionContext	execCtx(m_samplers2D, m_samplersCube);
		int					numPackets	= numVertices + ((numVertices%EXEC_VEC_WIDTH) ? 1 : 0);

		const vector<ShaderInput*>& inputs	= vertexShader.getInputs();
		vector<const Variable*>		outputs;
		vertexShader.getOutputs(outputs);

		// Set uniform values
		for (vector<VariableValue>::const_iterator uniformIter = uniformValues.begin(); uniformIter != uniformValues.end(); uniformIter++)
			execCtx.getValue(uniformIter->getVariable()) = uniformIter->getValue().value();

		for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
		{
			int packetStart	= packetNdx*EXEC_VEC_WIDTH;
			int packetEnd	= deMin32((packetNdx+1)*EXEC_VEC_WIDTH, numVertices);

			// Compute values for vertex shader inputs
			for (vector<ShaderInput*>::const_iterator i = inputs.begin(); i != inputs.end(); i++)
			{
				const ShaderInput*	input	= *i;
				ExecValueAccess		access	= execCtx.getValue(input->getVariable());

				for (int vtxNdx = packetStart; vtxNdx < packetEnd; vtxNdx++)
				{
					int		y	= (vtxNdx/gridVtxWidth);
					int		x	= vtxNdx - y*gridVtxWidth;
					float	xf	= (float)x / (float)(gridVtxWidth-1);
					float	yf	= (float)y / (float)(gridVtxHeight-1);

					interpolateVertexInput(access, vtxNdx-packetStart, input->getValueRange(), xf, yf);
				}
			}

			// Execute vertex shader for packet
			vertexShader.execute(execCtx);

			// Store output values
			for (vector<const Variable*>::const_iterator i = outputs.begin(); i != outputs.end(); i++)
			{
				const Variable*			output	= *i;

				if (deStringEqual(output->getName(), "gl_Position"))
					continue; // Do not store position

				ExecConstValueAccess	access	= execCtx.getValue(output);
				VaryingStorage*			dst		= varyingStore.getStorage(output->getType(), output->getName());

				for (int vtxNdx = packetStart; vtxNdx < packetEnd; vtxNdx++)
				{
					ValueAccess varyingAccess = dst->getValue(output->getType(), vtxNdx);
					copyVarying(varyingAccess, access, vtxNdx-packetStart);
				}
			}
		}
	}

	// Execute fragment shader
	{
		ExecutionContext execCtx(m_samplers2D, m_samplersCube);

		// Assign uniform values
		for (vector<VariableValue>::const_iterator i = uniformValues.begin(); i != uniformValues.end(); i++)
			execCtx.getValue(i->getVariable()) = i->getValue().value();

		const vector<ShaderInput*>& inputs			= fragmentShader.getInputs();
		const Variable*				fragColorVar	= DE_NULL;
		vector<const Variable*>		outputs;

		// Find fragment shader output assigned to location 0. This is fragment color.
		fragmentShader.getOutputs(outputs);
		for (vector<const Variable*>::const_iterator i = outputs.begin(); i != outputs.end(); i++)
		{
			if ((*i)->getLayoutLocation() == 0)
			{
				fragColorVar = *i;
				break;
			}
		}
		TCU_CHECK(fragColorVar);

		int	width		= m_dst.getWidth();
		int height		= m_dst.getHeight();
		int numPackets	= (width*height)/EXEC_VEC_WIDTH + (((width*height)%EXEC_VEC_WIDTH) ? 1 : 0);

		float cellWidth		= (float)width	/ (float)m_gridWidth;
		float cellHeight	= (float)height	/ (float)m_gridHeight;

		for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
		{
			int packetStart	= packetNdx*EXEC_VEC_WIDTH;
			int packetEnd	= deMin32((packetNdx+1)*EXEC_VEC_WIDTH, width*height);

			// Interpolate varyings
			for (vector<ShaderInput*>::const_iterator i = inputs.begin(); i != inputs.end(); i++)
			{
				const ShaderInput*		input	= *i;
				ExecValueAccess			access	= execCtx.getValue(input->getVariable());
				const VariableType&		type	= input->getVariable()->getType();
				const VaryingStorage*	src		= varyingStore.getStorage(type, input->getVariable()->getName());

				// \todo [2011-03-08 pyry] Part of this could be pre-computed...
				for (int fragNdx = packetStart; fragNdx < packetEnd; fragNdx++)
				{
					int y = fragNdx/width;
					int x = fragNdx - y*width;
					tcu::IVec4	vtxIndices	= computeVertexIndices(cellWidth, cellHeight, gridVtxWidth, gridVtxHeight, x, y);
					tcu::Vec2	weights		= computeGridCellWeights(cellWidth, cellHeight, x, y);

					interpolateFragmentInput(access, fragNdx-packetStart,
											 src->getValue(type, vtxIndices.x()),
											 src->getValue(type, vtxIndices.y()),
											 src->getValue(type, vtxIndices.z()),
											 src->getValue(type, vtxIndices.w()),
											 weights.x(), weights.y());
				}
			}

			// Execute fragment shader
			fragmentShader.execute(execCtx);

			// Write resulting color
			ExecConstValueAccess colorValue = execCtx.getValue(fragColorVar);
			for (int fragNdx = packetStart; fragNdx < packetEnd; fragNdx++)
			{
				int			y		= fragNdx/width;
				int			x		= fragNdx - y*width;
				int			cNdx	= fragNdx-packetStart;
				tcu::Vec4	c		= tcu::Vec4(colorValue.component(0).asFloat(cNdx),
												colorValue.component(1).asFloat(cNdx),
												colorValue.component(2).asFloat(cNdx),
												colorValue.component(3).asFloat(cNdx));

				// \todo [2012-11-13 pyry] Reverse order.
				m_dst.setPixel(c, x, m_dst.getHeight()-y-1);
			}
		}
	}
}